

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  uint uVar6;
  Descriptor *pDVar7;
  undefined4 extraout_var;
  FieldDescriptor *pFVar9;
  ulong uVar10;
  size_type sVar11;
  reference ppFVar12;
  FieldDescriptor *this;
  MapFieldBase *this_00;
  MapValueRef *this_01;
  Message *pMVar13;
  long *plVar14;
  int local_dc;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *value_field;
  FieldDescriptor *field;
  int i_1;
  undefined1 local_48 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *message_local;
  long *plVar8;
  
  pDVar7 = Message::GetDescriptor(message);
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar8 = (long *)CONCAT44(extraout_var,iVar3);
  for (fields.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      iVar3 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      iVar4 = Descriptor::field_count(pDVar7), iVar3 < iVar4;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pFVar9 = Descriptor::field(pDVar7,fields.
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar1 = FieldDescriptor::is_required(pFVar9);
    if (bVar1) {
      pFVar9 = Descriptor::field(pDVar7,fields.
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      uVar10 = (**(code **)(*plVar8 + 0x28))(plVar8,message,pFVar9);
      if ((uVar10 & 1) == 0) {
        message_local._7_1_ = 0;
        goto LAB_00595879;
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48);
  (**(code **)(*plVar8 + 0x80))
            (plVar8,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_48);
  field._0_4_ = 0;
  do {
    sVar11 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_48);
    if (sVar11 <= (ulong)(long)(int)field) {
      message_local._7_1_ = 1;
LAB_00595863:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
LAB_00595879:
      return (bool)(message_local._7_1_ & 1);
    }
    ppFVar12 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             *)local_48,(long)(int)field);
    pFVar9 = *ppFVar12;
    CVar5 = FieldDescriptor::cpp_type(pFVar9);
    if (CVar5 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(pFVar9);
      if (bVar1) {
        pDVar7 = FieldDescriptor::message_type(pFVar9);
        this = Descriptor::field(pDVar7,1);
        CVar5 = FieldDescriptor::cpp_type(this);
        if (CVar5 == CPPTYPE_MESSAGE) {
          this_00 = (MapFieldBase *)(**(code **)(*plVar8 + 0x2d8))(plVar8,message,pFVar9);
          bVar1 = MapFieldBase::IsMapValid(this_00);
          if (!bVar1) goto LAB_00595716;
          MapIterator::MapIterator((MapIterator *)&end.value_.type_,message,pFVar9);
          MapIterator::MapIterator((MapIterator *)&size,message,pFVar9);
          (*this_00->_vptr_MapFieldBase[6])(this_00,&end.value_.type_);
          (*this_00->_vptr_MapFieldBase[7])(this_00,&size);
          while (bVar1 = protobuf::operator!=((MapIterator *)&end.value_.type_,(MapIterator *)&size)
                , bVar1) {
            this_01 = MapIterator::GetValueRef((MapIterator *)&end.value_.type_);
            pMVar13 = MapValueRef::GetMessageValue(this_01);
            uVar6 = (*(pMVar13->super_MessageLite)._vptr_MessageLite[8])();
            if ((uVar6 & 1) == 0) {
              message_local._7_1_ = 0;
              j = 1;
              goto LAB_005956d0;
            }
            MapIterator::operator++((MapIterator *)&end.value_.type_);
          }
          j = 7;
LAB_005956d0:
          MapIterator::~MapIterator((MapIterator *)&size);
          MapIterator::~MapIterator((MapIterator *)&end.value_.type_);
          if (j != 7) goto LAB_00595863;
        }
      }
      else {
LAB_00595716:
        bVar1 = FieldDescriptor::is_repeated(pFVar9);
        if (bVar1) {
          iVar3 = (**(code **)(*plVar8 + 0x30))(plVar8,message,pFVar9);
          for (local_dc = 0; local_dc < iVar3; local_dc = local_dc + 1) {
            plVar14 = (long *)(**(code **)(*plVar8 + 0x1a0))(plVar8,message,pFVar9,local_dc);
            bVar2 = (**(code **)(*plVar14 + 0x40))();
            if ((bVar2 & 1) == 0) {
              message_local._7_1_ = 0;
              goto LAB_00595863;
            }
          }
        }
        else {
          plVar14 = (long *)(**(code **)(*plVar8 + 0xd8))(plVar8,message,pFVar9,0);
          bVar2 = (**(code **)(*plVar14 + 0x40))();
          if ((bVar2 & 1) == 0) {
            message_local._7_1_ = 0;
            goto LAB_00595863;
          }
        }
      }
    }
    field._0_4_ = (int)field + 1;
  } while( true );
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = message.GetReflection();

  // Check required fields of this message.
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      if (!reflection->HasField(message, descriptor->field(i))) {
        return false;
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          MapFieldBase* map_field =
              reflection->MapData(const_cast<Message*>(&message), field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                          .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}